

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode Curl_rtsp_parseheader(connectdata *conn,char *header)

{
  char *__s2;
  int iVar1;
  size_t __n;
  void *pvVar2;
  bool bVar3;
  byte *local_50;
  char *end;
  char *start;
  RTSP *rtsp;
  undefined8 uStack_30;
  int nc;
  long CSeq;
  Curl_easy *data;
  char *header_local;
  connectdata *conn_local;
  
  CSeq = (long)conn->data;
  uStack_30 = 0;
  data = (Curl_easy *)header;
  header_local = (char *)conn;
  iVar1 = curl_strnequal("CSeq:",header,5);
  if (iVar1 == 0) {
    iVar1 = curl_strnequal("Session:",(char *)data,8);
    if (iVar1 != 0) {
      end = (char *)&data->prev;
      while( true ) {
        bVar3 = false;
        if (*end != '\0') {
          iVar1 = Curl_isspace((uint)(byte)*end);
          bVar3 = iVar1 != 0;
        }
        if (!bVar3) break;
        end = end + 1;
      }
      if (*end == '\0') {
        Curl_failf((Curl_easy *)CSeq,"Got a blank Session ID");
      }
      else if (*(long *)(CSeq + 0xe38) == 0) {
        local_50 = (byte *)end;
        while( true ) {
          bVar3 = false;
          if ((*local_50 != 0) && (bVar3 = false, *local_50 != 0x3b)) {
            iVar1 = Curl_isspace((uint)*local_50);
            bVar3 = iVar1 == 0;
          }
          if (!bVar3) break;
          local_50 = local_50 + 1;
        }
        pvVar2 = (*Curl_cmalloc)((size_t)(local_50 + (1 - (long)end)));
        *(void **)(CSeq + 0xe38) = pvVar2;
        if (*(long *)(CSeq + 0xe38) == 0) {
          return CURLE_OUT_OF_MEMORY;
        }
        memcpy(*(void **)(CSeq + 0xe38),end,(long)local_50 - (long)end);
        local_50[*(long *)(CSeq + 0xe38) - (long)end] = 0;
      }
      else {
        __s2 = *(char **)(CSeq + 0xe38);
        __n = strlen(*(char **)(CSeq + 0xe38));
        iVar1 = strncmp(end,__s2,__n);
        if (iVar1 != 0) {
          Curl_failf((Curl_easy *)CSeq,"Got RTSP Session ID Line [%s], but wanted ID [%s]",end,
                     *(undefined8 *)(CSeq + 0xe38));
          return CURLE_RTSP_SESSION_ERROR;
        }
      }
    }
  }
  else {
    iVar1 = __isoc99_sscanf((undefined1 *)((long)&data->next + 4),": %ld",&stack0xffffffffffffffd0);
    if (iVar1 != 1) {
      Curl_failf((Curl_easy *)CSeq,"Unable to read the CSeq header: [%s]",data);
      return CURLE_RTSP_CSEQ_ERROR;
    }
    *(undefined8 *)(*(long *)(CSeq + 0x218) + 0x230) = uStack_30;
    *(undefined8 *)(CSeq + 0x15e0) = uStack_30;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct connectdata *conn,
                               char *header)
{
  struct Curl_easy *data = conn->data;
  long CSeq = 0;

  if(checkprefix("CSeq:", header)) {
    /* Store the received CSeq. Match is verified in rtsp_done */
    int nc = sscanf(&header[4], ": %ld", &CSeq);
    if(nc == 1) {
      struct RTSP *rtsp = data->req.protop;
      rtsp->CSeq_recv = CSeq; /* mark the request */
      data->state.rtsp_CSeq_recv = CSeq; /* update the handle */
    }
    else {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
  }
  else if(checkprefix("Session:", header)) {
    char *start;

    /* Find the first non-space letter */
    start = header + 8;
    while(*start && ISSPACE(*start))
      start++;

    if(!*start) {
      failf(data, "Got a blank Session ID");
    }
    else if(data->set.str[STRING_RTSP_SESSION_ID]) {
      /* If the Session ID is set, then compare */
      if(strncmp(start, data->set.str[STRING_RTSP_SESSION_ID],
                 strlen(data->set.str[STRING_RTSP_SESSION_ID]))  != 0) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then set
       * it.
       *
       * Allow any non whitespace content, up to the field separator or end of
       * line. RFC 2326 isn't 100% clear on the session ID and for example
       * gstreamer does url-encoded session ID's not covered by the standard.
       */
      char *end = start;
      while(*end && *end != ';' && !ISSPACE(*end))
        end++;

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = malloc(end - start + 1);
      if(data->set.str[STRING_RTSP_SESSION_ID] == NULL)
        return CURLE_OUT_OF_MEMORY;
      memcpy(data->set.str[STRING_RTSP_SESSION_ID], start, end - start);
      (data->set.str[STRING_RTSP_SESSION_ID])[end - start] = '\0';
    }
  }
  return CURLE_OK;
}